

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void init_fields(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  _Alloc_hider _Var39;
  size_type sVar40;
  _Alloc_hider _Var41;
  size_type sVar42;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> uVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  ostream *poVar47;
  _Head_base<0UL,_spatial_region_*,_false> this;
  __uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_> this_00;
  ulong uVar48;
  char *pcVar49;
  uint uVar50;
  ulong uVar51;
  undefined1 **ppuVar52;
  uint uVar53;
  uint uVar54;
  long lVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  double dVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined8 in_XMM7_Qb;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  double dVar152;
  undefined8 in_XMM8_Qb;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  double dVar156;
  undefined8 uVar157;
  undefined8 in_XMM12_Qb;
  undefined8 in_XMM13_Qb;
  undefined8 uVar158;
  undefined8 in_XMM14_Qb;
  string f_reflection2;
  string f_reflection3;
  string f_reflection1;
  string lp_reflection2;
  string lp_reflection1;
  string lp_reflection3;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar46 = (long)mpi_rank;
  iVar44 = std::__cxx11::string::compare((char *)&f_envelope_abi_cxx11_);
  sVar42 = f_reflection_abi_cxx11_._M_string_length;
  _Var41 = f_reflection_abi_cxx11_._M_dataplus;
  sVar40 = lp_reflection_abi_cxx11_._M_string_length;
  _Var39 = lp_reflection_abi_cxx11_._M_dataplus;
  if (iVar44 != 0) {
    iVar44 = std::__cxx11::string::compare((char *)&f_envelope_abi_cxx11_);
    if (iVar44 == 0) {
      spatial_region::f_init_uniformB
                ((spatial_region *)
                 psr._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a0y,a0z);
      return;
    }
    iVar44 = std::__cxx11::string::compare((char *)&f_envelope_abi_cxx11_);
    if ((iVar44 != 0) && (mpi_rank == 0)) {
      poVar47 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,TERM_RED_abi_cxx11_._M_dataplus._M_p,
                           TERM_RED_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar47,"Unknown f_envelope value [",0x1a);
      poVar47 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar47,f_envelope_abi_cxx11_._M_dataplus._M_p,
                           f_envelope_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar47,"] during initialization",0x17);
      poVar47 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar47,TERM_NO_COLOR_abi_cxx11_._M_dataplus._M_p,
                           TERM_NO_COLOR_abi_cxx11_._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar47 + -0x18) + (char)poVar47);
      std::ostream::put((char)poVar47);
      std::ostream::flush();
    }
    sVar42 = f_reflection_abi_cxx11_._M_string_length;
    _Var41._M_p = f_reflection_abi_cxx11_._M_dataplus._M_p;
    sVar40 = lp_reflection_abi_cxx11_._M_string_length;
    _Var39._M_p = lp_reflection_abi_cxx11_._M_dataplus._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    uVar50 = (uint)sVar40;
    if ((int)uVar50 < 1) {
      uVar48 = 0;
    }
    else {
      uVar48 = 0;
      do {
        if (_Var39._M_p[uVar48] == '&') goto LAB_0011c249;
        std::__cxx11::string::push_back((char)local_70);
        uVar48 = uVar48 + 1;
      } while ((uVar50 & 0x7fffffff) != uVar48);
      uVar48 = sVar40 & 0xffffffff;
    }
LAB_0011c249:
    uVar53 = (int)uVar48 + 1;
    uVar54 = uVar53;
    if ((int)uVar53 < (int)uVar50) {
      pcVar49 = _Var39._M_p + (uVar48 & 0xffffffff) + 1;
      do {
        uVar54 = uVar53;
        if (*pcVar49 == '&') break;
        std::__cxx11::string::push_back((char)local_90);
        uVar53 = uVar53 + 1;
        pcVar49 = pcVar49 + 1;
        uVar54 = uVar50;
      } while ((int)uVar53 < (int)uVar50);
    }
    if ((int)(uVar54 + 1) < (int)uVar50) {
      lVar55 = (long)(int)uVar54;
      do {
        if (_Var39._M_p[lVar55 + 1] == '&') break;
        std::__cxx11::string::push_back((char)local_50);
        lVar55 = lVar55 + 1;
      } while (uVar50 - 1 != (int)lVar55);
    }
    uVar50 = (uint)sVar42;
    if ((int)uVar50 < 1) {
      uVar48 = 0;
    }
    else {
      uVar51 = 0;
      do {
        uVar48 = uVar51;
        if (_Var41._M_p[uVar51] == '&') break;
        std::__cxx11::string::push_back((char)local_b0);
        uVar51 = uVar51 + 1;
        uVar48 = sVar42;
      } while ((uVar50 & 0x7fffffff) != uVar51);
    }
    uVar53 = (int)uVar48 + 1;
    uVar54 = uVar53;
    if ((int)uVar53 < (int)uVar50) {
      pcVar49 = _Var41._M_p + (uVar48 & 0xffffffff) + 1;
      do {
        uVar54 = uVar53;
        if (*pcVar49 == '&') break;
        std::__cxx11::string::push_back((char)local_f0);
        uVar53 = uVar53 + 1;
        pcVar49 = pcVar49 + 1;
        uVar54 = uVar50;
      } while ((int)uVar53 < (int)uVar50);
    }
    if ((int)(uVar54 + 1) < (int)uVar50) {
      lVar55 = (long)(int)uVar54;
      do {
        if (_Var41._M_p[lVar55 + 1] == '&') break;
        std::__cxx11::string::push_back((char)local_d0);
        lVar55 = lVar55 + 1;
      } while (uVar50 - 1 != (int)lVar55);
    }
    uVar158 = 0;
    auVar118._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar46];
    auVar118._8_8_ = in_XMM8_Qb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dx;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = xlength * 0.5 + x0;
    auVar1 = vfnmadd132sd_fma(auVar118,auVar150,auVar1);
    dVar58 = auVar1._0_8_;
    uVar157 = 0;
    this_00._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
         (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
         (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
         psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
         super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
         super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
    dVar156 = z00;
    dVar152 = y00;
    dVar57 = a0z;
    dVar136 = x0;
    dVar59 = phi_rotate;
    dVar56 = a0y;
    if ((phi_rotate == 0.0) && (!NAN(phi_rotate))) {
      spatial_region::f_init_cos
                ((spatial_region *)
                 psr._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a0y,a0z,xsigma,ysigma,
                 zsigma,dVar58,sscos,b_sign,x0,phase,y00,z00,true,0.0,xtarget,ytarget,ztarget);
      if ((phi != 0.0) || (NAN(phi))) {
        auVar119._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar119._8_8_ = in_XMM14_Qb;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dx;
        auVar151._8_8_ = 0;
        auVar151._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar119,auVar151,auVar2);
        dVar58 = auVar1._0_8_;
        dVar136 = -x0;
        dVar152 = -y00;
        dVar156 = -z00;
        this_00._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
             (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
        dVar57 = a0z;
        dVar59 = phi;
        dVar56 = a0y;
      }
      else {
        iVar44 = std::__cxx11::string::compare((char *)local_70);
        uVar43 = psr;
        if (iVar44 == 0) {
          iVar44 = std::__cxx11::string::compare((char *)local_b0);
          dVar156 = -a0y;
          lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
          iVar45 = std::__cxx11::string::compare((char *)local_b0);
          auVar120._0_8_ =
               (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar46];
          auVar120._8_8_ = in_XMM14_Qb;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dx;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = xlength * 0.5 + x0;
          auVar1 = vfnmadd132sd_fma(auVar120,auVar75,auVar17);
          auVar153._0_8_ = -z00;
          auVar153._8_8_ = 0x8000000000000000;
          dVar58 = (double)vmovlpd_avx(auVar153);
          spatial_region::f_init_cos
                    ((spatial_region *)
                     uVar43._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                     (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                     (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                     xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,x0,phase,y00,dVar58,true,0.0,
                     xtarget,ytarget,ztarget);
          iVar44 = std::__cxx11::string::compare((char *)local_90);
          uVar43 = psr;
          if (iVar44 == 0) {
            iVar44 = std::__cxx11::string::compare((char *)local_f0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar130._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar130._8_8_ = uVar158;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = dx;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = xlength * 0.5 + x0;
            auVar1 = vfnmadd132sd_fma(auVar130,auVar92,auVar33);
            auVar93._0_8_ = -y00;
            auVar93._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar93);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,x0,phase,dVar58,z00,
                       true,0.0,xtarget,ytarget,ztarget);
            uVar43 = psr;
            iVar44 = std::__cxx11::string::compare((char *)local_f0);
            dVar58 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar131._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar131._8_8_ = uVar157;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = dx;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = xlength * 0.5 + x0;
            auVar118 = vfnmadd132sd_fma(auVar131,auVar94,auVar34);
            auVar95._8_8_ = 0;
            auVar95._0_8_ = y00;
            auVar1 = vmovhpd_avx(auVar95,z00);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar118._0_8_,sscos,b_sign,x0,phase,
                       -auVar1._0_8_,-auVar1._8_8_,true,0.0,xtarget,ytarget,ztarget);
            iVar44 = std::__cxx11::string::compare((char *)local_50);
            uVar43 = psr;
            if (iVar44 != 0) goto LAB_0011ca6a;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar58 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar132._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar132._8_8_ = uVar157;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = dx;
            auVar146._8_8_ = 0;
            auVar146._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar132,auVar146,auVar35);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,-x0,phase,y00,z00,
                       true,0.0,xtarget,ytarget,ztarget);
            uVar43 = psr;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar133._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar133._8_8_ = uVar157;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = dx;
            auVar147._8_8_ = 0;
            auVar147._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar133,auVar147,auVar36);
            auVar155._0_8_ = -z00;
            auVar155._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar155);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,-x0,phase,y00,dVar58
                       ,true,0.0,xtarget,ytarget,ztarget);
            uVar43 = psr;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar134._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar134._8_8_ = uVar157;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = dx;
            auVar148._8_8_ = 0;
            auVar148._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar134,auVar148,auVar37);
            auVar96._0_8_ = -y00;
            auVar96._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar96);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,-x0,phase,dVar58,z00
                       ,true,0.0,xtarget,ytarget,ztarget);
            this_00._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar56 = (double)((ulong)(iVar44 == 0) * (long)-a0y + (ulong)(iVar44 != 0) * (long)a0y);
            iVar44 = std::__cxx11::string::compare((char *)local_f0);
            dVar57 = (double)((ulong)(iVar44 == 0) * (long)-a0z + (ulong)(iVar44 != 0) * (long)a0z);
            auVar135._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar135._8_8_ = uVar157;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = dx;
            auVar149._8_8_ = 0;
            auVar149._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar135,auVar149,auVar38);
            dVar58 = auVar1._0_8_;
            dVar136 = -x0;
          }
          else {
            iVar44 = std::__cxx11::string::compare((char *)local_90);
            uVar43 = psr;
            if (iVar44 != 0) goto LAB_0011ca6a;
            iVar44 = std::__cxx11::string::compare((char *)local_f0);
            dVar58 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar121._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar121._8_8_ = uVar158;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dx;
            auVar140._8_8_ = 0;
            auVar140._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar121,auVar140,auVar18);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,-x0,phase,y00,z00,
                       true,0.0,xtarget,ytarget,ztarget);
            uVar43 = psr;
            iVar44 = std::__cxx11::string::compare((char *)local_f0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar122._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar122._8_8_ = uVar157;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = dx;
            auVar141._8_8_ = 0;
            auVar141._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar122,auVar141,auVar19);
            auVar154._0_8_ = -z00;
            auVar154._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar154);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,-x0,phase,y00,dVar58
                       ,true,0.0,xtarget,ytarget,ztarget);
            iVar44 = std::__cxx11::string::compare((char *)local_50);
            uVar43 = psr;
            if (iVar44 != 0) goto LAB_0011ca6a;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar123._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar123._8_8_ = uVar157;
            auVar20._8_8_ = 0;
            auVar20._0_8_ = dx;
            auVar142._8_8_ = 0;
            auVar142._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar123,auVar142,auVar20);
            auVar76._0_8_ = -y00;
            auVar76._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar76);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,-x0,phase,dVar58,z00
                       ,true,0.0,xtarget,ytarget,ztarget);
            uVar43 = psr;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar124._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar124._8_8_ = uVar157;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = dx;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = x0 + xlength * 0.5;
            auVar1 = vfnmadd132sd_fma(auVar124,auVar77,auVar21);
            auVar78._0_8_ = -y00;
            auVar78._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar78);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,x0,phase,dVar58,z00,
                       true,0.0,xtarget,ytarget,ztarget);
            uVar43 = psr;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar58 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar125._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar125._8_8_ = uVar157;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = dx;
            auVar143._8_8_ = 0;
            auVar143._0_8_ = xlength * 0.5 - x0;
            auVar118 = vfnmadd132sd_fma(auVar125,auVar143,auVar22);
            auVar79._8_8_ = 0;
            auVar79._0_8_ = y00;
            auVar1 = vmovhpd_avx(auVar79,z00);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar118._0_8_,sscos,b_sign,-x0,phase,
                       -auVar1._0_8_,-auVar1._8_8_,true,0.0,xtarget,ytarget,ztarget);
            this_00._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            iVar44 = std::__cxx11::string::compare((char *)local_d0);
            dVar56 = (double)((ulong)(iVar44 == 0) * (long)-a0y + (ulong)(iVar44 != 0) * (long)a0y);
            iVar44 = std::__cxx11::string::compare((char *)local_f0);
            dVar57 = (double)((ulong)(iVar44 == 0) * (long)-a0z + (ulong)(iVar44 != 0) * (long)a0z);
            auVar126._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar126._8_8_ = uVar157;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = dx;
            auVar80._8_8_ = 0;
            auVar80._0_8_ = x0 + xlength * 0.5;
            auVar1 = vfnmadd132sd_fma(auVar126,auVar80,auVar23);
            dVar58 = auVar1._0_8_;
            dVar136 = x0;
          }
          dVar152 = -y00;
          dVar156 = -z00;
        }
        else {
          iVar44 = std::__cxx11::string::compare((char *)local_70);
          uVar43 = psr;
          if (iVar44 == 0) {
            iVar44 = std::__cxx11::string::compare((char *)local_b0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_b0);
            auVar127._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar127._8_8_ = in_XMM14_Qb;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = dx;
            auVar89._8_8_ = 0;
            auVar89._0_8_ = xlength * 0.5 + x0;
            auVar1 = vfnmadd132sd_fma(auVar127,auVar89,auVar30);
            auVar90._0_8_ = -y00;
            auVar90._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar90);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,x0,phase,dVar58,z00,
                       true,0.0,xtarget,ytarget,ztarget);
            iVar44 = std::__cxx11::string::compare((char *)local_90);
            uVar43 = psr;
            if (iVar44 != 0) goto LAB_0011ca6a;
            iVar44 = std::__cxx11::string::compare((char *)local_f0);
            dVar156 = -a0y;
            lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
            iVar45 = std::__cxx11::string::compare((char *)local_f0);
            auVar128._0_8_ =
                 (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar46];
            auVar128._8_8_ = uVar158;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = dx;
            auVar144._8_8_ = 0;
            auVar144._0_8_ = xlength * 0.5 - x0;
            auVar1 = vfnmadd132sd_fma(auVar128,auVar144,auVar31);
            auVar91._0_8_ = -y00;
            auVar91._8_8_ = 0x8000000000000000;
            dVar58 = (double)vmovlpd_avx(auVar91);
            spatial_region::f_init_cos
                      ((spatial_region *)
                       uVar43._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                       (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                       (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z
                               ),xsigma,ysigma,zsigma,auVar1._0_8_,sscos,b_sign,-x0,phase,dVar58,z00
                       ,true,0.0,xtarget,ytarget,ztarget);
            this_00._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            ppuVar52 = local_f0;
            iVar44 = std::__cxx11::string::compare((char *)ppuVar52);
          }
          else {
            iVar44 = std::__cxx11::string::compare((char *)local_70);
            this_00._M_t.
            super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
            super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)
                 (tuple<spatial_region_*,_std::default_delete<spatial_region>_>)psr;
            if (iVar44 != 0) goto LAB_0011ca6a;
            ppuVar52 = local_b0;
            iVar44 = std::__cxx11::string::compare((char *)ppuVar52);
          }
          dVar56 = (double)((ulong)(iVar44 == 0) * (long)-a0y + (ulong)(iVar44 != 0) * (long)a0y);
          iVar44 = std::__cxx11::string::compare((char *)ppuVar52);
          dVar57 = (double)((ulong)(iVar44 == 0) * (long)-a0z + (ulong)(iVar44 != 0) * (long)a0z);
          auVar129._0_8_ =
               (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar46];
          auVar129._8_8_ = in_XMM14_Qb;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dx;
          auVar145._8_8_ = 0;
          auVar145._0_8_ = xlength * 0.5 - x0;
          auVar1 = vfnmadd132sd_fma(auVar129,auVar145,auVar32);
          dVar58 = auVar1._0_8_;
          dVar136 = -x0;
          dVar156 = z00;
          dVar152 = y00;
        }
        dVar59 = 0.0;
      }
    }
    spatial_region::f_init_cos
              ((spatial_region *)
               this_00._M_t.
               super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dVar56,dVar57,xsigma,
               ysigma,zsigma,dVar58,sscos,b_sign,dVar136,phase,dVar152,dVar156,true,dVar59,xtarget,
               ytarget,ztarget);
    goto LAB_0011ca6a;
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar50 = (uint)sVar40;
  if ((int)uVar50 < 1) {
    uVar48 = 0;
  }
  else {
    uVar48 = 0;
    do {
      if (_Var39._M_p[uVar48] == '&') goto LAB_0011c570;
      std::__cxx11::string::push_back((char)local_70);
      uVar48 = uVar48 + 1;
    } while ((uVar50 & 0x7fffffff) != uVar48);
    uVar48 = sVar40 & 0xffffffff;
  }
LAB_0011c570:
  uVar53 = (int)uVar48 + 1;
  uVar54 = uVar53;
  if ((int)uVar53 < (int)uVar50) {
    pcVar49 = _Var39._M_p + (uVar48 & 0xffffffff) + 1;
    do {
      uVar54 = uVar53;
      if (*pcVar49 == '&') break;
      std::__cxx11::string::push_back((char)local_90);
      uVar53 = uVar53 + 1;
      pcVar49 = pcVar49 + 1;
      uVar54 = uVar50;
    } while ((int)uVar53 < (int)uVar50);
  }
  if ((int)(uVar54 + 1) < (int)uVar50) {
    lVar55 = (long)(int)uVar54;
    do {
      if (_Var39._M_p[lVar55 + 1] == '&') break;
      std::__cxx11::string::push_back((char)local_50);
      lVar55 = lVar55 + 1;
    } while (uVar50 - 1 != (int)lVar55);
  }
  uVar50 = (uint)sVar42;
  if ((int)uVar50 < 1) {
    uVar48 = 0;
  }
  else {
    uVar51 = 0;
    do {
      uVar48 = uVar51;
      if (_Var41._M_p[uVar51] == '&') break;
      std::__cxx11::string::push_back((char)local_b0);
      uVar51 = uVar51 + 1;
      uVar48 = sVar42;
    } while ((uVar50 & 0x7fffffff) != uVar51);
  }
  uVar53 = (int)uVar48 + 1;
  uVar54 = uVar53;
  if ((int)uVar53 < (int)uVar50) {
    pcVar49 = _Var41._M_p + (uVar48 & 0xffffffff) + 1;
    do {
      uVar54 = uVar53;
      if (*pcVar49 == '&') break;
      std::__cxx11::string::push_back((char)local_f0);
      uVar53 = uVar53 + 1;
      pcVar49 = pcVar49 + 1;
      uVar54 = uVar50;
    } while ((int)uVar53 < (int)uVar50);
  }
  if ((int)(uVar54 + 1) < (int)uVar50) {
    lVar55 = (long)(int)uVar54;
    do {
      if (_Var41._M_p[lVar55 + 1] == '&') break;
      std::__cxx11::string::push_back((char)local_d0);
      lVar55 = lVar55 + 1;
    } while (uVar50 - 1 != (int)lVar55);
  }
  if ((shenergy != 0.0) || (NAN(shenergy))) {
    dVar58 = 1.0 - shenergy;
    if (dVar58 < 0.0) {
      dVar58 = sqrt(dVar58);
    }
    else {
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar58;
      auVar1 = vsqrtsd_avx(auVar60,auVar60);
      dVar58 = auVar1._0_8_;
    }
    auVar61._8_8_ = 0;
    auVar61._0_8_ = shenergy;
    if (shenergy < 0.0) {
      dVar156 = sqrt(shenergy);
    }
    else {
      auVar1 = vsqrtsd_avx(auVar61,auVar61);
      dVar156 = auVar1._0_8_;
    }
    auVar99._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar46];
    auVar99._8_8_ = in_XMM7_Qb;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dx;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = xlength * 0.5 + x0;
    auVar1 = vfnmadd132sd_fma(auVar99,auVar138,auVar4);
    spatial_region::f_init_focused
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dVar58 * a0y,dVar58 * a0z
               ,xsigma,sigma0,auVar1._0_8_,x0,b_sign,phase,y00,z00,false,0.0,sscos,1.0,xtarget,
               ytarget,ztarget);
    auVar100._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar46];
    auVar100._8_8_ = in_XMM12_Qb;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dx;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = xlength * 0.5 + x0;
    auVar1 = vfnmadd132sd_fma(auVar100,auVar139,auVar5);
    uVar157 = 0;
    spatial_region::f_init_focused
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dVar156 * a0y,
               dVar156 * a0z,xsigma,sigma0,auVar1._0_8_,x0,b_sign,shphase,y00,z00,true,0.0,sscos,2.0
               ,xtarget,ytarget,ztarget);
  }
  else {
    auVar98._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar46];
    auVar98._8_8_ = in_XMM7_Qb;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dx;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = xlength * 0.5 + x0;
    auVar1 = vfnmadd132sd_fma(auVar98,auVar137,auVar3);
    uVar157 = 0;
    spatial_region::f_init_focused
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a0y,a0z,xsigma,sigma0,
               auVar1._0_8_,x0,b_sign,phase,y00,z00,false,0.0,sscos,1.0,xtarget,ytarget,ztarget);
  }
  if ((phi != 0.0) || (NAN(phi))) {
    auVar101._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar46];
    auVar101._8_8_ = in_XMM13_Qb;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dx;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = xlength * 0.5 - x0;
    auVar1 = vfnmadd132sd_fma(auVar101,auVar97,auVar6);
    dVar58 = auVar1._0_8_;
    dVar136 = -x0;
    this._M_head_impl =
         (spatial_region *)
         psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
         super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
         super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
    dVar156 = -z00;
    dVar152 = a0z;
    dVar57 = -y00;
    dVar59 = phi;
    dVar56 = a0y;
  }
  else {
    iVar44 = std::__cxx11::string::compare((char *)local_70);
    uVar43 = psr;
    if (iVar44 == 0) {
      iVar44 = std::__cxx11::string::compare((char *)local_b0);
      dVar156 = -a0y;
      lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
      iVar45 = std::__cxx11::string::compare((char *)local_b0);
      auVar102._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar46];
      auVar102._8_8_ = in_XMM12_Qb;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dx;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = xlength * 0.5 + x0;
      auVar1 = vfnmadd132sd_fma(auVar102,auVar62,auVar7);
      auVar63._0_8_ = -z00;
      auVar63._8_8_ = 0x8000000000000000;
      dVar58 = (double)vmovlpd_avx(auVar63);
      spatial_region::f_init_focused
                ((spatial_region *)
                 uVar43._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                 (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                 (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                 xsigma,sigma0,auVar1._0_8_,x0,b_sign,phase,y00,dVar58,true,0.0,sscos,1.0,xtarget,
                 ytarget,ztarget);
      iVar44 = std::__cxx11::string::compare((char *)local_90);
      uVar43 = psr;
      if (iVar44 == 0) {
        iVar44 = std::__cxx11::string::compare((char *)local_f0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar112._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar112._8_8_ = in_XMM12_Qb;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dx;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = xlength * 0.5 + x0;
        auVar1 = vfnmadd132sd_fma(auVar112,auVar81,auVar24);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        uVar43 = psr;
        iVar44 = std::__cxx11::string::compare((char *)local_f0);
        dVar156 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar113._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar113._8_8_ = uVar157;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dx;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = xlength * 0.5 + x0;
        auVar1 = vfnmadd132sd_fma(auVar113,auVar82,auVar25);
        auVar83._0_8_ = -z00;
        auVar83._8_8_ = 0x8000000000000000;
        dVar58 = (double)vmovlpd_avx(auVar83);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,x0,b_sign,phase,-y00,dVar58,true,0.0,sscos,1.0,xtarget
                   ,ytarget,ztarget);
        iVar44 = std::__cxx11::string::compare((char *)local_50);
        uVar43 = psr;
        if (iVar44 != 0) goto LAB_0011ca6a;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar114._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar114._8_8_ = uVar157;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dx;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar114,auVar84,auVar26);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        uVar43 = psr;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar156 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar115._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar115._8_8_ = uVar157;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dx;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar115,auVar85,auVar27);
        auVar86._0_8_ = -z00;
        auVar86._8_8_ = 0x8000000000000000;
        dVar58 = (double)vmovlpd_avx(auVar86);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,y00,dVar58,true,0.0,sscos,1.0,xtarget
                   ,ytarget,ztarget);
        uVar43 = psr;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar116._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar116._8_8_ = uVar157;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dx;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar116,auVar87,auVar28);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        this._M_head_impl = (spatial_region *)psr;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar56 = (double)((ulong)(iVar44 == 0) * (long)-a0y + (ulong)(iVar44 != 0) * (long)a0y);
        iVar44 = std::__cxx11::string::compare((char *)local_f0);
        dVar152 = (double)((ulong)(iVar44 == 0) * (long)-a0z + (ulong)(iVar44 != 0) * (long)a0z);
        auVar117._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar117._8_8_ = uVar157;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dx;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar117,auVar88,auVar29);
        dVar58 = auVar1._0_8_;
        dVar136 = -x0;
      }
      else {
        iVar44 = std::__cxx11::string::compare((char *)local_90);
        uVar43 = psr;
        if (iVar44 != 0) goto LAB_0011ca6a;
        iVar44 = std::__cxx11::string::compare((char *)local_f0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar103._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar103._8_8_ = in_XMM12_Qb;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dx;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar103,auVar64,auVar8);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        uVar43 = psr;
        iVar44 = std::__cxx11::string::compare((char *)local_f0);
        dVar156 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar104._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar104._8_8_ = uVar157;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dx;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar104,auVar65,auVar9);
        auVar66._0_8_ = -z00;
        auVar66._8_8_ = 0x8000000000000000;
        dVar58 = (double)vmovlpd_avx(auVar66);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,y00,dVar58,true,0.0,sscos,1.0,xtarget
                   ,ytarget,ztarget);
        iVar44 = std::__cxx11::string::compare((char *)local_50);
        uVar43 = psr;
        if (iVar44 != 0) goto LAB_0011ca6a;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar105._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar105._8_8_ = uVar157;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = dx;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar105,auVar67,auVar10);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        uVar43 = psr;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar106._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar106._8_8_ = uVar157;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dx;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = xlength * 0.5 + x0;
        auVar1 = vfnmadd132sd_fma(auVar106,auVar68,auVar11);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        uVar43 = psr;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar156 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar107._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar107._8_8_ = uVar157;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dx;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar107,auVar69,auVar12);
        auVar70._0_8_ = -z00;
        auVar70._8_8_ = 0x8000000000000000;
        dVar58 = (double)vmovlpd_avx(auVar70);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar156 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,-y00,dVar58,true,0.0,sscos,1.0,
                   xtarget,ytarget,ztarget);
        this._M_head_impl = (spatial_region *)psr;
        iVar44 = std::__cxx11::string::compare((char *)local_d0);
        dVar56 = (double)((ulong)(iVar44 == 0) * (long)-a0y + (ulong)(iVar44 != 0) * (long)a0y);
        iVar44 = std::__cxx11::string::compare((char *)local_f0);
        dVar152 = (double)((ulong)(iVar44 == 0) * (long)-a0z + (ulong)(iVar44 != 0) * (long)a0z);
        auVar108._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar108._8_8_ = uVar157;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dx;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = xlength * 0.5 + x0;
        auVar1 = vfnmadd132sd_fma(auVar108,auVar71,auVar13);
        dVar58 = auVar1._0_8_;
        dVar136 = x0;
      }
      dVar57 = -y00;
      dVar156 = -z00;
      dVar59 = 0.0;
    }
    else {
      iVar44 = std::__cxx11::string::compare((char *)local_70);
      uVar43 = psr;
      if (iVar44 == 0) {
        iVar44 = std::__cxx11::string::compare((char *)local_b0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_b0);
        auVar109._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar109._8_8_ = in_XMM12_Qb;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dx;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = xlength * 0.5 + x0;
        auVar1 = vfnmadd132sd_fma(auVar109,auVar72,auVar14);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        iVar44 = std::__cxx11::string::compare((char *)local_90);
        uVar43 = psr;
        if (iVar44 != 0) goto LAB_0011ca6a;
        iVar44 = std::__cxx11::string::compare((char *)local_f0);
        dVar58 = -a0y;
        lVar55 = (ulong)(iVar44 != 0) * (long)a0y;
        iVar45 = std::__cxx11::string::compare((char *)local_f0);
        auVar110._0_8_ =
             (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar46];
        auVar110._8_8_ = in_XMM12_Qb;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dx;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = xlength * 0.5 - x0;
        auVar1 = vfnmadd132sd_fma(auVar110,auVar73,auVar15);
        spatial_region::f_init_focused
                  ((spatial_region *)
                   uVar43._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
                   (double)((ulong)(iVar44 == 0) * (long)dVar58 + lVar55),
                   (double)((ulong)(iVar45 == 0) * (long)-a0z + (ulong)(iVar45 != 0) * (long)a0z),
                   xsigma,sigma0,auVar1._0_8_,-x0,b_sign,phase,-y00,z00,true,0.0,sscos,1.0,xtarget,
                   ytarget,ztarget);
        this._M_head_impl = (spatial_region *)psr;
        ppuVar52 = local_f0;
        iVar44 = std::__cxx11::string::compare((char *)ppuVar52);
      }
      else {
        iVar44 = std::__cxx11::string::compare((char *)local_70);
        this._M_head_impl = (spatial_region *)psr;
        if (iVar44 != 0) goto LAB_0011ca6a;
        ppuVar52 = local_b0;
        iVar44 = std::__cxx11::string::compare((char *)ppuVar52);
      }
      dVar56 = (double)((ulong)(iVar44 == 0) * (long)-a0y + (ulong)(iVar44 != 0) * (long)a0y);
      iVar44 = std::__cxx11::string::compare((char *)ppuVar52);
      dVar152 = (double)((ulong)(iVar44 == 0) * (long)-a0z + (ulong)(iVar44 != 0) * (long)a0z);
      auVar111._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar46];
      auVar111._8_8_ = in_XMM13_Qb;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dx;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = xlength * 0.5 - x0;
      auVar1 = vfnmadd132sd_fma(auVar111,auVar74,auVar16);
      dVar58 = auVar1._0_8_;
      dVar136 = -x0;
      dVar59 = 0.0;
      dVar156 = z00;
      dVar57 = y00;
    }
  }
  spatial_region::f_init_focused
            (this._M_head_impl,dVar56,dVar152,xsigma,sigma0,dVar58,dVar136,b_sign,phase,dVar57,
             dVar156,true,dVar59,sscos,1.0,xtarget,ytarget,ztarget);
LAB_0011ca6a:
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void init_fields()
{
    int i = mpi_rank;
    if (f_envelope=="focused")
    {
        const char* tmpl = lp_reflection.c_str();
        int lp_len = lp_reflection.size();
        const char* tmpf = f_reflection.c_str();
        int f_len = f_reflection.size();
        std::string lp_reflection1 = "";
        std::string lp_reflection2 = "";
        std::string lp_reflection3 = "";
        std::string f_reflection1 = "";
        std::string f_reflection2 = "";
        std::string f_reflection3 = "";
        int jj;
        for( jj=0;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
            lp_reflection1 += tmpl[jj];
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection2 += tmpl[jj];
            }
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection3 += tmpl[jj];
            }
        }
        for( jj=0;jj<f_len&&tmpf[jj]!='&';jj++ ) {
            f_reflection1 += tmpf[jj];
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection2 += tmpf[jj];
            }
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection3 += tmpf[jj];
            }
        }
        if (shenergy == 0) 
            psr->f_init_focused(a0y,a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,z00,0,0,sscos,1,xtarget,ytarget,ztarget);
        else  // adding second harmonic
        {
            double alpha, beta;
            alpha = sqrt(1 - shenergy);
            beta = sqrt(shenergy);
            psr->f_init_focused(a0y * alpha, a0z * alpha, xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,z00,0,0,sscos,1,xtarget,ytarget,ztarget);
            psr->f_init_focused(a0y * beta, a0z * beta, xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign, shphase,y00,z00, 1, 0,sscos, 2,xtarget,ytarget,ztarget);
        }
        if (phi!=0) {
            psr->f_init_focused(a0y,a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,phi,sscos,1,xtarget,ytarget,ztarget);
        }
        else if (lp_reflection1=="xy") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            if (lp_reflection2=="xz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                if (lp_reflection3=="yz") {
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                }
            }
            else if (lp_reflection2=="yz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                if (lp_reflection3=="xz") {
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                }
            }
        }
        else if (lp_reflection1=="xz") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            if (lp_reflection2=="yz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            }
        }
        else if (lp_reflection1=="yz") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
        }
    } else if (f_envelope == "uniformB") {
        psr->f_init_uniformB(a0y, a0z);
    }
    else // f_envelope == "cos"
    {
        if (f_envelope != "cos") {
            if (mpi_rank == 0) {
                cout << TERM_RED << "Unknown f_envelope value [" << f_envelope << "] during initialization"
                     << TERM_NO_COLOR << endl;
            }
        }
        const char* tmpl = lp_reflection.c_str();
        int lp_len = lp_reflection.size();
        const char* tmpf = f_reflection.c_str();
        int f_len = f_reflection.size();
        std::string lp_reflection1 = "";
        std::string lp_reflection2 = "";
        std::string lp_reflection3 = "";
        std::string f_reflection1 = "";
        std::string f_reflection2 = "";
        std::string f_reflection3 = "";
        int jj;
        for( jj=0;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
            lp_reflection1 += tmpl[jj];
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection2 += tmpl[jj];
            }
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection3 += tmpl[jj];
            }
        }
        for( jj=0;jj<f_len&&tmpf[jj]!='&';jj++ ) {
            f_reflection1 += tmpf[jj];
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection2 += tmpf[jj];
            }
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection3 += tmpf[jj];
            }
        }

        if (phi_rotate != 0) {
            psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,z00,1,phi_rotate,xtarget,ytarget,ztarget);
        } else {
            psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,z00,true,0,xtarget,ytarget,ztarget);
            if (phi!=0) {
                psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2-x0-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,phi,xtarget,ytarget,ztarget);
            }
            else if (lp_reflection1=="xy") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                if (lp_reflection2=="xz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    if (lp_reflection3=="yz") {
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    }
                }
                else if (lp_reflection2=="yz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                    if (lp_reflection3=="xz") {
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,x0+xlength/2-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,x0+xlength/2-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    }
                }
            }
            else if (lp_reflection1=="xz") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                if (lp_reflection2=="yz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                }
            }
            else if (lp_reflection1=="yz") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
            }
        }
    }
}